

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XercesAttGroupInfo.cpp
# Opt level: O3

void __thiscall
xercesc_4_0::XercesAttGroupInfo::XercesAttGroupInfo
          (XercesAttGroupInfo *this,uint attGroupNameId,uint attGroupNamespaceId,
          MemoryManager *manager)

{
  (this->super_XSerializable)._vptr_XSerializable = (_func_int **)&PTR__XercesAttGroupInfo_0040f300;
  this->fTypeWithId = false;
  this->fNameId = attGroupNameId;
  this->fNamespaceId = attGroupNamespaceId;
  this->fAttributes = (RefVectorOf<xercesc_4_0::SchemaAttDef> *)0x0;
  this->fAnyAttributes = (RefVectorOf<xercesc_4_0::SchemaAttDef> *)0x0;
  this->fCompleteWildCard = (SchemaAttDef *)0x0;
  this->fMemoryManager = manager;
  return;
}

Assistant:

XercesAttGroupInfo::XercesAttGroupInfo(unsigned int attGroupNameId,
                                       unsigned int attGroupNamespaceId,
                                       MemoryManager* const manager)
    : fTypeWithId(false)
    , fNameId(attGroupNameId)
    , fNamespaceId(attGroupNamespaceId)
    , fAttributes(0)
    , fAnyAttributes(0)
    , fCompleteWildCard(0)
    , fMemoryManager(manager)
{

}